

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Int_t * Abc_NtkNodeSupportInt(Abc_Ntk_t *pNtk,int iCo)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int iCo_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((iCo < 0) || (iVar1 = Abc_NtkCoNum(pNtk), iVar1 <= iCo)) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_34);
      (pAVar2->field_6).iTemp = local_34;
    }
    Abc_NtkIncrementTravId(pNtk);
    pAVar2 = Abc_NtkCo(pNtk,iCo);
    pNtk_local = (Abc_Ntk_t *)Vec_IntAlloc(100);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    Abc_NtkNodeSupportInt_rec(pAVar2,(Vec_Int_t *)pNtk_local);
    Vec_IntSort((Vec_Int_t *)pNtk_local,0);
  }
  return (Vec_Int_t *)pNtk_local;
}

Assistant:

Vec_Int_t * Abc_NtkNodeSupportInt( Abc_Ntk_t * pNtk, int iCo )
{
    Vec_Int_t * vNodes;
    Abc_Obj_t * pObj; 
    int i;
    if ( iCo < 0 || iCo >= Abc_NtkCoNum(pNtk) )
        return NULL;
    // save node indices in the CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    // collect the indexes of CI nodes in the TFI of the CO node
    Abc_NtkIncrementTravId( pNtk );
    pObj = Abc_NtkCo( pNtk, iCo );
    vNodes = Vec_IntAlloc( 100 );
    Abc_NtkNodeSupportInt_rec( Abc_ObjFanin0(pObj), vNodes );
    Vec_IntSort( vNodes, 0 );
    return vNodes;
}